

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

void __thiscall
ODDLParser::OpenDDLParser::setBuffer
          (OpenDDLParser *this,vector<char,_std::allocator<char>_> *buffer)

{
  pointer __src;
  size_t __n;
  
  clear(this);
  std::vector<char,_std::allocator<char>_>::resize
            (&this->m_buffer,
             (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start);
  __src = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_start;
  __n = (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove((this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start,__src,__n);
    return;
  }
  return;
}

Assistant:

void OpenDDLParser::setBuffer( const std::vector<char> &buffer ) {
    clear();
    m_buffer.resize( buffer.size() );
    std::copy( buffer.begin(), buffer.end(), m_buffer.begin() );
}